

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O3

int __thiscall
QMetaObjectBuilder::addClassInfo(QMetaObjectBuilder *this,QByteArray *name,QByteArray *value)

{
  qsizetype i;
  QList<QByteArray> *pQVar1;
  
  i = (this->d->classInfoNames).d.size;
  pQVar1 = &this->d->classInfoNames;
  QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray_const&>
            ((QMovableArrayOps<QByteArray> *)pQVar1,i,name);
  QList<QByteArray>::end(pQVar1);
  pQVar1 = &this->d->classInfoValues;
  QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray_const&>
            ((QMovableArrayOps<QByteArray> *)pQVar1,(this->d->classInfoValues).d.size,value);
  QList<QByteArray>::end(pQVar1);
  return (int)i;
}

Assistant:

int QMetaObjectBuilder::addClassInfo(const QByteArray &name, const QByteArray &value)
{
    int index = d->classInfoNames.size();
    d->classInfoNames += name;
    d->classInfoValues += value;
    return index;
}